

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

BinaryOperator slang::ast::Expression::getBinaryOperator(SyntaxKind kind)

{
  BinaryOperator BVar1;
  logic_error *this;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(kind) {
  case LessThanEqualExpression:
    BVar1 = LessThanEqual;
    break;
  case LessThanExpression:
    BVar1 = LessThan;
    break;
  case LetDeclaration:
  case LineDirective:
  case LocalScope:
  case LocalVariableDeclaration:
  case LogicType:
  case LongIntType:
  case LoopConstraint:
  case LoopGenerate:
  case LoopStatement:
  case MacroActualArgument:
  case MacroActualArgumentList:
  case MacroArgumentDefault:
  case MacroFormalArgument:
  case MacroFormalArgumentList:
  case MacroUsage:
  case MatchesClause:
  case MemberAccessExpression:
  case MinTypMaxExpression:
switchD_0031d628_caseD_29:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_d9);
    std::operator+(&local_98,&local_b8,":");
    std::__cxx11::to_string(&local_d8,0x813);
    std::operator+(&local_78,&local_98,&local_d8);
    std::operator+(&local_58,&local_78,": ");
    std::operator+(&local_38,&local_58,"Default case should be unreachable!");
    std::logic_error::logic_error(this,(string *)&local_38);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case LogicalAndExpression:
    BVar1 = LogicalAnd;
    break;
  case LogicalEquivalenceExpression:
    BVar1 = LogicalEquivalence;
    break;
  case LogicalImplicationExpression:
    BVar1 = LogicalImplication;
    break;
  case LogicalLeftShiftAssignmentExpression:
  case LogicalShiftLeftExpression:
    BVar1 = LogicalShiftLeft;
    break;
  case LogicalOrExpression:
    BVar1 = LogicalOr;
    break;
  case LogicalRightShiftAssignmentExpression:
  case LogicalShiftRightExpression:
    BVar1 = LogicalShiftRight;
    break;
  case ModAssignmentExpression:
  case ModExpression:
    BVar1 = Mod;
    break;
  default:
    switch(kind) {
    case AddAssignmentExpression:
    case AddExpression:
      BVar1 = Add;
      break;
    case AlwaysBlock:
    case AlwaysCombBlock:
    case AlwaysFFBlock:
    case AlwaysLatchBlock:
    case AndPropertyExpr:
    case AndSequenceExpr:
    case AnsiPortList:
    case AnsiUdpPortList:
    case ArgumentList:
      goto switchD_0031d628_caseD_29;
    case AndAssignmentExpression:
switchD_0031d628_caseD_28:
      BVar1 = BinaryAnd;
      break;
    case ArithmeticLeftShiftAssignmentExpression:
    case ArithmeticShiftLeftExpression:
      BVar1 = ArithmeticShiftLeft;
      break;
    case ArithmeticRightShiftAssignmentExpression:
    case ArithmeticShiftRightExpression:
      BVar1 = ArithmeticShiftRight;
      break;
    default:
      switch(kind) {
      case BinaryAndExpression:
        goto switchD_0031d628_caseD_28;
      case BinaryBinsSelectExpr:
      case BinaryBlockEventExpression:
      case BinaryEventExpression:
        goto switchD_0031d628_caseD_29;
      case BinaryXnorExpression:
        return BinaryXnor;
      case BinaryXorExpression:
        return BinaryXor;
      default:
        if (kind == CaseEqualityExpression) {
          return CaseEquality;
        }
        if (kind == CaseInequalityExpression) {
          return CaseInequality;
        }
        if ((kind == DivideAssignmentExpression) || (kind == DivideExpression)) {
          return Divide;
        }
        if (kind == EqualityExpression) {
          return Equality;
        }
        if (kind == GreaterThanEqualExpression) {
          return GreaterThanEqual;
        }
        if (kind == GreaterThanExpression) {
          return GreaterThan;
        }
        if (kind == InequalityExpression) {
          return Inequality;
        }
        if ((kind == MultiplyAssignmentExpression) || (kind == MultiplyExpression)) {
          return Multiply;
        }
        if (kind != OrAssignmentExpression) {
          if (kind == PowerExpression) {
            return Power;
          }
          if (kind != SubtractAssignmentExpression) {
            if (kind == XorAssignmentExpression) {
              return BinaryXor;
            }
            if (kind == WildcardEqualityExpression) {
              return WildcardEquality;
            }
            if (kind == WildcardInequalityExpression) {
              return WildcardInequality;
            }
            if (kind != SubtractExpression) goto switchD_0031d628_caseD_29;
          }
          return Subtract;
        }
      case BinaryOrExpression:
        BVar1 = BinaryOr;
      }
    }
  }
  return BVar1;
}

Assistant:

BinaryOperator Expression::getBinaryOperator(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::BinaryAndExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::BinaryOrExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::BinaryXorExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::BinaryXnorExpression:
            return BinaryOperator::BinaryXnor;
        case SyntaxKind::EqualityExpression:
            return BinaryOperator::Equality;
        case SyntaxKind::InequalityExpression:
            return BinaryOperator::Inequality;
        case SyntaxKind::CaseEqualityExpression:
            return BinaryOperator::CaseEquality;
        case SyntaxKind::CaseInequalityExpression:
            return BinaryOperator::CaseInequality;
        case SyntaxKind::GreaterThanEqualExpression:
            return BinaryOperator::GreaterThanEqual;
        case SyntaxKind::GreaterThanExpression:
            return BinaryOperator::GreaterThan;
        case SyntaxKind::LessThanEqualExpression:
            return BinaryOperator::LessThanEqual;
        case SyntaxKind::LessThanExpression:
            return BinaryOperator::LessThan;
        case SyntaxKind::WildcardEqualityExpression:
            return BinaryOperator::WildcardEquality;
        case SyntaxKind::WildcardInequalityExpression:
            return BinaryOperator::WildcardInequality;
        case SyntaxKind::LogicalAndExpression:
            return BinaryOperator::LogicalAnd;
        case SyntaxKind::LogicalOrExpression:
            return BinaryOperator::LogicalOr;
        case SyntaxKind::LogicalImplicationExpression:
            return BinaryOperator::LogicalImplication;
        case SyntaxKind::LogicalEquivalenceExpression:
            return BinaryOperator::LogicalEquivalence;
        case SyntaxKind::LogicalShiftLeftExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalShiftRightExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticShiftLeftExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticShiftRightExpression:
            return BinaryOperator::ArithmeticShiftRight;
        case SyntaxKind::PowerExpression:
            return BinaryOperator::Power;
        case SyntaxKind::AddAssignmentExpression:
            return BinaryOperator::Add;
        case SyntaxKind::SubtractAssignmentExpression:
            return BinaryOperator::Subtract;
        case SyntaxKind::MultiplyAssignmentExpression:
            return BinaryOperator::Multiply;
        case SyntaxKind::DivideAssignmentExpression:
            return BinaryOperator::Divide;
        case SyntaxKind::ModAssignmentExpression:
            return BinaryOperator::Mod;
        case SyntaxKind::AndAssignmentExpression:
            return BinaryOperator::BinaryAnd;
        case SyntaxKind::OrAssignmentExpression:
            return BinaryOperator::BinaryOr;
        case SyntaxKind::XorAssignmentExpression:
            return BinaryOperator::BinaryXor;
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftLeft;
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
            return BinaryOperator::LogicalShiftRight;
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftLeft;
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
            return BinaryOperator::ArithmeticShiftRight;
        default:
            ASSUME_UNREACHABLE;
    }
}